

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.h
# Opt level: O2

btScalar __thiscall
btCollisionWorld::ClosestConvexResultCallback::addSingleResult
          (ClosestConvexResultCallback *this,LocalConvexResult *convexResult,bool normalInWorldSpace
          )

{
  btCollisionObject *pbVar1;
  undefined8 uVar2;
  undefined3 in_register_00000011;
  btVector3 bVar3;
  
  (this->super_ConvexResultCallback).m_closestHitFraction = convexResult->m_hitFraction;
  pbVar1 = convexResult->m_hitCollisionObject;
  this->m_hitCollisionObject = pbVar1;
  if (CONCAT31(in_register_00000011,normalInWorldSpace) == 0) {
    bVar3 = operator*(&(pbVar1->m_worldTransform).m_basis,&convexResult->m_hitNormalLocal);
    *&(this->m_hitNormalWorld).m_floats = bVar3.m_floats;
  }
  else {
    uVar2 = *(undefined8 *)((convexResult->m_hitNormalLocal).m_floats + 2);
    *(undefined8 *)(this->m_hitNormalWorld).m_floats =
         *(undefined8 *)(convexResult->m_hitNormalLocal).m_floats;
    *(undefined8 *)((this->m_hitNormalWorld).m_floats + 2) = uVar2;
  }
  uVar2 = *(undefined8 *)((convexResult->m_hitPointLocal).m_floats + 2);
  *(undefined8 *)(this->m_hitPointWorld).m_floats =
       *(undefined8 *)(convexResult->m_hitPointLocal).m_floats;
  *(undefined8 *)((this->m_hitPointWorld).m_floats + 2) = uVar2;
  return convexResult->m_hitFraction;
}

Assistant:

virtual	btScalar	addSingleResult(LocalConvexResult& convexResult,bool normalInWorldSpace)
		{
//caller already does the filter on the m_closestHitFraction
			btAssert(convexResult.m_hitFraction <= m_closestHitFraction);
						
			m_closestHitFraction = convexResult.m_hitFraction;
			m_hitCollisionObject = convexResult.m_hitCollisionObject;
			if (normalInWorldSpace)
			{
				m_hitNormalWorld = convexResult.m_hitNormalLocal;
			} else
			{
				///need to transform normal into worldspace
				m_hitNormalWorld = m_hitCollisionObject->getWorldTransform().getBasis()*convexResult.m_hitNormalLocal;
			}
			m_hitPointWorld = convexResult.m_hitPointLocal;
			return convexResult.m_hitFraction;
		}